

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

QTreeWidgetItem * __thiscall QTreeWidgetItem::takeChild(QTreeWidgetItem *this,int index)

{
  QTreeWidgetItem *pQVar1;
  int iVar2;
  SortOrder SVar3;
  QTreeWidgetItem *this_00;
  QTreeView *pQVar4;
  QHeaderView *pQVar5;
  QTreeWidgetItem *pQVar6;
  iterator iVar7;
  ulong uVar8;
  QTreeWidgetItemPrivate *this_01;
  long in_FS_OFFSET;
  QList<QTreeWidgetItem_*> local_58;
  QTreeWidgetItem *local_40;
  long local_38;
  
  this_01 = (QTreeWidgetItemPrivate *)&local_58;
  uVar8 = (ulong)(uint)index;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = this;
  this_00 = (QTreeWidgetItem *)treeModel(this,(QTreeWidget *)0x0);
  if (((this_00 != (QTreeWidgetItem *)0x0) &&
      (*(undefined1 *)((long)&(this_00->children).d.size + 4) = 0,
      (int)(this_00->children).d.size != 0)) && (*(long *)(*(long *)&this_00->rtti + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    iVar2 = QHeaderView::sortIndicatorSection(pQVar5);
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    SVar3 = QHeaderView::sortIndicatorOrder(pQVar5);
    pQVar6 = this_00;
    (**(code **)(*(long *)&this_00->_vptr_QTreeWidgetItem + 0x140))(this_00,iVar2,SVar3);
  }
  if ((index < 0) || ((ulong)(this->children).d.size <= uVar8)) {
    pQVar6 = (QTreeWidgetItem *)0x0;
  }
  else {
    if (this_00 != (QTreeWidgetItem *)0x0) {
      pQVar6 = this_00;
      QTreeModel::beginRemoveItems((QTreeModel *)this_00,this,index,1);
    }
    QTreeWidgetItemPrivate::updateHiddenStatus
              ((QTreeWidgetItemPrivate *)pQVar6,(this->children).d.ptr[uVar8],false);
    pQVar6 = QList<QTreeWidgetItem_*>::takeAt(&this->children,uVar8);
    pQVar6->par = (QTreeWidgetItem *)0x0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (QTreeWidgetItem **)0x0;
    local_58.d.size = 0;
    local_40 = pQVar6;
    QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
              ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,0,&local_40);
    QList<QTreeWidgetItem_*>::end(&local_58);
    if ((QVariant *)local_58.d.size != (QVariant *)0x0) {
      do {
        this_01 = (QTreeWidgetItemPrivate *)&local_58;
        iVar7 = QList<QTreeWidgetItem_*>::end(&local_58);
        pQVar1 = iVar7.i[-1];
        local_58.d.size = (qsizetype)&(((QVariant *)(local_58.d.size + -0x20))->d).field_0x1f;
        pQVar1->view = (QTreeWidget *)0x0;
        if ((pQVar1->children).d.size != 0) {
          uVar8 = 0;
          do {
            local_40 = (pQVar1->children).d.ptr[uVar8];
            QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                      ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,local_58.d.size,&local_40);
            this_01 = (QTreeWidgetItemPrivate *)&local_58;
            QList<QTreeWidgetItem_*>::end(&local_58);
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)(pQVar1->children).d.size);
        }
      } while ((QVariant *)local_58.d.size != (QVariant *)0x0);
    }
    QTreeWidgetItemPrivate::propagateDisabled(this_01,pQVar6);
    if (this_00 != (QTreeWidgetItem *)0x0) {
      QAbstractItemModel::endRemoveRows();
    }
    if ((QTreeWidgetItem *)local_58.d.d != (QTreeWidgetItem *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidgetItem::takeChild(int index)
{
    // we move this outside the check of the index to allow executing
    // pending sorts from inline functions, using this function (hack)
    QTreeModel *model = treeModel();
    if (model) {
        // This will trigger a layoutChanged signal, thus we might want to optimize
        // this function by not emitting the rowsRemoved signal etc to the view.
        // On the other hand we also need to make sure that the selectionmodel
        // is updated in case we take an item that is selected.
        model->skipPendingSort = false;
        model->executePendingSort();
    }
    if (index >= 0 && index < children.size()) {
        if (model) model->beginRemoveItems(this, index, 1);
        d->updateHiddenStatus(children.at(index), false);
        QTreeWidgetItem *item = children.takeAt(index);
        item->par = nullptr;
        QStack<QTreeWidgetItem*> stack;
        stack.push(item);
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = nullptr;
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        d->propagateDisabled(item);
        if (model) model->endRemoveRows();
        return item;
    }
    return nullptr;
}